

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NodeCollectFanins(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  long lVar1;
  
  vNodes->nSize = 0;
  for (lVar1 = 0; lVar1 < (pNode->vFanins).nSize; lVar1 = lVar1 + 1) {
    Vec_PtrPush(vNodes,pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar1]]);
  }
  return;
}

Assistant:

void Abc_NodeCollectFanins( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    Vec_PtrClear(vNodes);
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Vec_PtrPush( vNodes, pFanin );
}